

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_start_doc(Parser *this,bool as_child)

{
  ulong uVar1;
  Tree *pTVar2;
  size_t node;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  NodeData *pNVar10;
  size_t *psVar11;
  size_t ichild;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  NodeData *pNVar15;
  byte bVar16;
  char msg [58];
  char local_128 [72];
  undefined4 local_e0;
  undefined1 local_dc;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar16 = 0;
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '_';
    local_128[9] = '\\';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    local_128[0x18] = 'x';
    local_128[0x19] = -0x5e;
    local_128[0x1a] = '!';
    local_128[0x1b] = '\0';
    local_128[0x1c] = '\0';
    local_128[0x1d] = '\0';
    local_128[0x1e] = '\0';
    local_128[0x1f] = '\0';
    local_128[0x20] = 'e';
    local_128[0x21] = '\0';
    local_128[0x22] = 0;
    local_128[0x23] = '\0';
    local_128[0x24] = '\0';
    local_128[0x25] = '\0';
    local_128[0x26] = '\0';
    local_128[0x27] = '\0';
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  uVar1 = ((this->m_stack).m_stack)->node_id;
  if (uVar1 == 0xffffffffffffffff) {
    pNVar15 = (NodeData *)0x0;
  }
  else {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= uVar1) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar15 = pTVar2->m_buf + uVar1;
  }
  uVar1 = this->m_root_id;
  if (uVar1 == 0xffffffffffffffff) {
    pNVar10 = (NodeData *)0x0;
  }
  else {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= uVar1) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar10 = pTVar2->m_buf + uVar1;
  }
  if (pNVar15 != pNVar10) {
    builtin_strncpy(local_128 + 0x30,"root_id))",10);
    builtin_strncpy(local_128 + 0x20,"om()) == node(m_",0x10);
    builtin_strncpy(local_128 + 0x10,"ode(m_stack.bott",0x10);
    builtin_strncpy(local_128,"check failed: (n",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_58 = 0;
    uStack_50 = 0x775e;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x775e) << 0x40);
    LVar4.name.str._0_4_ = 0x21a278;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar1 = (this->m_stack).m_size;
  psVar11 = &(this->m_stack).m_stack[uVar1 - 2].node_id;
  if (uVar1 < 2) {
    psVar11 = &this->m_root_id;
  }
  node = *psVar11;
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_128,"check failed: (parent_id != NONE)",0x22);
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_80 = 0;
    uStack_78 = 0x7760;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x7760) << 0x40);
    LVar6.name.str._0_4_ = 0x21a278;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x22,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  bVar9 = Tree::is_root(this->m_tree,node);
  if (!bVar9) {
    builtin_strncpy(local_128 + 0x20,"arent_id))",0xb);
    builtin_strncpy(local_128 + 0x10,"_tree->is_root(p",0x10);
    builtin_strncpy(local_128,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_a8 = 0;
    uStack_a0 = 0x7761;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x7761) << 0x40);
    LVar7.name.str._0_4_ = 0x21a278;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x2b,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar1 = this->m_state->node_id;
  if (uVar1 != 0xffffffffffffffff) {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= uVar1) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar2->m_buf != (NodeData *)0x0) {
      uVar1 = this->m_state->node_id;
      if (uVar1 == 0xffffffffffffffff) {
        pNVar15 = (NodeData *)0x0;
      }
      else {
        pTVar2 = this->m_tree;
        if (pTVar2->m_cap <= uVar1) {
          if ((s_error_flags & 1) != 0) {
            bVar9 = is_debugger_attached();
            if (bVar9) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          local_128[0x18] = 'x';
          local_128[0x19] = -0x5e;
          local_128[0x1a] = '!';
          local_128[0x1b] = '\0';
          local_128[0x1c] = '\0';
          local_128[0x1d] = '\0';
          local_128[0x1e] = '\0';
          local_128[0x1f] = '\0';
          local_128[0x20] = 'e';
          local_128[0x21] = '\0';
          local_128[0x22] = 0;
          local_128[0x23] = '\0';
          local_128[0x24] = '\0';
          local_128[0x25] = '\0';
          local_128[0x26] = '\0';
          local_128[0x27] = '\0';
          (*(code *)PTR_error_impl_0024dab8)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar15 = pTVar2->m_buf + uVar1;
      }
      uVar1 = this->m_root_id;
      if (uVar1 == 0xffffffffffffffff) {
        pNVar10 = (NodeData *)0x0;
      }
      else {
        pTVar2 = this->m_tree;
        if (pTVar2->m_cap <= uVar1) {
          if ((s_error_flags & 1) != 0) {
            bVar9 = is_debugger_attached();
            if (bVar9) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          local_128[0x18] = 'x';
          local_128[0x19] = -0x5e;
          local_128[0x1a] = '!';
          local_128[0x1b] = '\0';
          local_128[0x1c] = '\0';
          local_128[0x1d] = '\0';
          local_128[0x1e] = '\0';
          local_128[0x1f] = '\0';
          local_128[0x20] = 'e';
          local_128[0x21] = '\0';
          local_128[0x22] = 0;
          local_128[0x23] = '\0';
          local_128[0x24] = '\0';
          local_128[0x25] = '\0';
          local_128[0x26] = '\0';
          local_128[0x27] = '\0';
          (*(code *)PTR_error_impl_0024dab8)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar10 = pTVar2->m_buf + uVar1;
      }
      if (pNVar15 != pNVar10) {
        pcVar13 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
        pcVar14 = local_128;
        for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
          *(undefined8 *)pcVar14 = *(undefined8 *)pcVar13;
          pcVar13 = pcVar13 + ((ulong)bVar16 * -2 + 1) * 8;
          pcVar14 = pcVar14 + ((ulong)bVar16 * -2 + 1) * 8;
        }
        local_dc = 0;
        local_e0 = 0x29296469;
        if ((s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        local_d0 = 0;
        uStack_c8 = 0x7762;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        auVar5 = ZEXT1224(ZEXT412(0x7762) << 0x40);
        LVar8.name.str._0_4_ = 0x21a278;
        LVar8.super_LineCol.offset = auVar5._0_8_;
        LVar8.super_LineCol.line = auVar5._8_8_;
        LVar8.super_LineCol.col = auVar5._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_128,0x4d,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  if (as_child) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((~(int)pTVar2->m_buf[node].m_type.type & 0x28U) != 0) {
      Tree::set_root_as_stream(this->m_tree);
    }
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar1 = pTVar2->m_buf[node].m_last_child;
    if (node == 0xffffffffffffffff) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x4f;
      local_128[9] = 'L';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = 'x';
      local_128[0x19] = -0x5e;
      local_128[0x1a] = '!';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0x20] = 'e';
      local_128[0x21] = '\0';
      local_128[0x22] = 0;
      local_128[0x23] = '\0';
      local_128[0x24] = '\0';
      local_128[0x25] = '\0';
      local_128[0x26] = '\0';
      local_128[0x27] = '\0';
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar2->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
      bVar9 = Tree::is_root(pTVar2,node);
      if (!bVar9) {
        if ((s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x4e;
        local_128[9] = 'L';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        local_128[0x18] = 'x';
        local_128[0x19] = -0x5e;
        local_128[0x1a] = '!';
        local_128[0x1b] = '\0';
        local_128[0x1c] = '\0';
        local_128[0x1d] = '\0';
        local_128[0x1e] = '\0';
        local_128[0x1f] = '\0';
        local_128[0x20] = 'e';
        local_128[0x21] = '\0';
        local_128[0x22] = 0;
        local_128[0x23] = '\0';
        local_128[0x24] = '\0';
        local_128[0x25] = '\0';
        local_128[0x26] = '\0';
        local_128[0x27] = '\0';
        (*(code *)PTR_error_impl_0024dab8)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    if (uVar1 != 0xffffffffffffffff) {
      if (pTVar2->m_cap <= uVar1) {
        if ((s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x7d;
        local_128[9] = 'K';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        local_128[0x18] = 'x';
        local_128[0x19] = -0x5e;
        local_128[0x1a] = '!';
        local_128[0x1b] = '\0';
        local_128[0x1c] = '\0';
        local_128[0x1d] = '\0';
        local_128[0x1e] = '\0';
        local_128[0x1f] = '\0';
        local_128[0x20] = 'e';
        local_128[0x21] = '\0';
        local_128[0x22] = 0;
        local_128[0x23] = '\0';
        local_128[0x24] = '\0';
        local_128[0x25] = '\0';
        local_128[0x26] = '\0';
        local_128[0x27] = '\0';
        (*(code *)PTR_error_impl_0024dab8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (pTVar2->m_buf[uVar1].m_parent != node) {
        if ((s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x4d;
        local_128[9] = 'L';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        local_128[0x18] = 'x';
        local_128[0x19] = -0x5e;
        local_128[0x1a] = '!';
        local_128[0x1b] = '\0';
        local_128[0x1c] = '\0';
        local_128[0x1d] = '\0';
        local_128[0x1e] = '\0';
        local_128[0x1f] = '\0';
        local_128[0x20] = 'e';
        local_128[0x21] = '\0';
        local_128[0x22] = 0;
        local_128[0x23] = '\0';
        local_128[0x24] = '\0';
        local_128[0x25] = '\0';
        local_128[0x26] = '\0';
        local_128[0x27] = '\0';
        (*(code *)PTR_error_impl_0024dab8)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    ichild = Tree::_claim(pTVar2);
    Tree::_set_hierarchy(pTVar2,ichild,node,uVar1);
    this->m_state->node_id = ichild;
    Tree::to_doc(this->m_tree,ichild,0);
  }
  this->m_state->flags = this->m_state->flags | 0x1003;
  _handle_types(this);
  this->m_state->flags = this->m_state->flags & 0xffffefff;
  return;
}

Assistant:

void Parser::_start_doc(bool as_child)
{
    _c4dbgpf("start_doc (as child={})", as_child);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_root(parent_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        _c4dbgpf("start_doc: parent={}", parent_id);
        if( ! m_tree->is_stream(parent_id))
        {
            _c4dbgp("start_doc: rearranging with root as STREAM");
            m_tree->set_root_as_stream();
        }
        m_state->node_id = m_tree->append_child(parent_id);
        m_tree->to_doc(m_state->node_id);
    }
    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(parent_id) || m_tree->empty(parent_id));
        m_state->node_id = parent_id;
        if( ! m_tree->is_doc(parent_id))
        {
            m_tree->to_doc(parent_id, DOC);
        }
    }
    #endif
    _c4dbgpf("start_doc: id={}", m_state->node_id);
    add_flags(RUNK|RTOP|NDOC);
    _handle_types();
    rem_flags(NDOC);
}